

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_container.cpp
# Opt level: O0

bool __thiscall
cppnet::TimerContainer::InnerAddTimer
          (TimerContainer *this,shared_ptr<cppnet::TimerSlot> *ptr,uint32_t time)

{
  ushort index;
  bool bVar1;
  uint16_t type;
  element_type *peVar2;
  mapped_type *this_00;
  mapped_type *this_01;
  weak_ptr<cppnet::TimerSlot> local_40;
  uint local_30;
  key_type_conflict local_2c;
  ushort local_26;
  uint32_t left_time;
  uint16_t cur_index;
  shared_ptr<cppnet::TimerSlot> *psStack_20;
  uint32_t time_local;
  shared_ptr<cppnet::TimerSlot> *ptr_local;
  TimerContainer *this_local;
  
  if (this->_timer_max < time) {
    this_local._7_1_ = false;
  }
  else {
    local_26 = (short)(time / this->_time_unit) + (short)this->_cur_time;
    if (this->_size <= (uint)local_26) {
      local_26 = local_26 - (short)this->_size;
    }
    local_2c = time % this->_time_unit;
    left_time = time;
    psStack_20 = ptr;
    ptr_local = (shared_ptr<cppnet::TimerSlot> *)this;
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->_sub_timer);
    if (!bVar1) {
      local_2c = 0;
    }
    peVar2 = std::__shared_ptr_access<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)ptr);
    index = local_26;
    type = TimeUnit2TimeType(this,this->_time_unit);
    TimerSlot::SetCurIndex(peVar2,index,type);
    peVar2 = std::__shared_ptr_access<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)ptr);
    TimerSlot::TimePass(peVar2,left_time - local_2c);
    local_30 = (uint)local_26;
    this_00 = std::
              unordered_map<unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>_>_>
              ::operator[](&this->_timer_wheel,&local_30);
    this_01 = std::
              map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>
              ::operator[](this_00,&local_2c);
    std::weak_ptr<cppnet::TimerSlot>::weak_ptr<cppnet::TimerSlot,void>(&local_40,ptr);
    std::__cxx11::
    list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>::
    push_back(this_01,&local_40);
    std::weak_ptr<cppnet::TimerSlot>::~weak_ptr(&local_40);
    this_local._7_1_ = Bitmap::Insert(&this->_bitmap,(uint)local_26);
  }
  return this_local._7_1_;
}

Assistant:

bool TimerContainer::InnerAddTimer(std::shared_ptr<TimerSlot> ptr, uint32_t time) {
    if (time > _timer_max) {
        return false;
    }
    
    uint16_t cur_index = time / _time_unit + _cur_time;
    if (cur_index >= _size) {
        cur_index -= _size;
    }
    uint32_t left_time = time % _time_unit;
    // don't have sub timer
    if (!_sub_timer) {
        left_time = 0;
    }
    ptr->SetCurIndex(cur_index, TimeUnit2TimeType(_time_unit));
    ptr->TimePass(time - left_time);

    _timer_wheel[cur_index][left_time].push_back(ptr);
    return _bitmap.Insert(cur_index);
}